

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_makefilename(_glist *x,char *file,char *result,int resultsize)

{
  char *__src;
  int iVar1;
  _canvasenvironment *p_Var2;
  size_t sVar3;
  int nleft;
  char *dir;
  int resultsize_local;
  char *result_local;
  char *file_local;
  _glist *x_local;
  
  p_Var2 = canvas_getenv(x);
  __src = p_Var2->ce_dir->s_name;
  if ((*file == '/') || (((*file != '\0' && (file[1] == ':')) || (*__src == '\0')))) {
    strncpy(result,file,(long)resultsize);
    result[resultsize + -1] = '\0';
  }
  else {
    strncpy(result,__src,(long)resultsize);
    result[resultsize + -1] = '\0';
    sVar3 = strlen(result);
    iVar1 = (resultsize - (int)sVar3) + -1;
    if (0 < iVar1) {
      strcat(result,"/");
      strncat(result,file,(long)iVar1);
      result[resultsize + -1] = '\0';
    }
  }
  return;
}

Assistant:

void canvas_makefilename(const t_canvas *x, const char *file, char *result, int resultsize)
{
    const char *dir = canvas_getenv(x)->ce_dir->s_name;
    if (file[0] == '/' || (file[0] && file[1] == ':') || !*dir)
    {
        strncpy(result, file, resultsize);
        result[resultsize-1] = 0;
    }
    else
    {
        int nleft;
        strncpy(result, dir, resultsize);
        result[resultsize-1] = 0;
        nleft = resultsize - (int)strlen(result) - 1;
        if (nleft <= 0) return;
        strcat(result, "/");
        strncat(result, file, nleft);
        result[resultsize-1] = 0;
    }
}